

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_int8_suite::test_array64_int8_two(void)

{
  value_type expected [2];
  value_type input [11];
  decoder decoder;
  undefined2 local_72;
  value local_70 [2];
  uchar local_68 [16];
  decoder local_58;
  
  local_68[0] = 0xd8;
  local_68[1] = '\x02';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\x12';
  local_68[10] = '4';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[11]>
            (&local_58,(uchar (*) [11])local_68);
  local_70[0] = local_58.current.code;
  local_70[1] = 0xd8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array64_int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x65d,"void compact_int8_suite::test_array64_int8_two()",local_70,local_70 + 1);
  local_72 = 0x3412;
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x663,"void compact_int8_suite::test_array64_int8_two()",local_58.current.view._M_str,
             local_58.current.view._M_str + local_58.current.view._M_len,&local_72,local_70);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_70[0] = local_58.current.code;
  local_70[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x665,"void compact_int8_suite::test_array64_int8_two()",local_70,local_70 + 1);
  return;
}

Assistant:

void test_array64_int8_two()
{
    const value_type input[] = { token::code::array64_int8, 0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x12, 0x34 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array64_int8);
    const value_type expected[] = {
        0x12, 0x34
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}